

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  char cVar1;
  uint lim;
  uint uVar2;
  uint uVar3;
  GCtrace *T_00;
  SnapEntry *pSVar4;
  lua_State *L_00;
  TValue *pTVar5;
  uint uVar6;
  uint ref_00;
  SnapShot *pSVar7;
  BloomFilter rfilt_00;
  uint *puVar8;
  TValue *o_00;
  uint local_cc;
  MSize j;
  IRIns *ir;
  IRRef ref;
  TValue *o;
  SnapEntry sn;
  lua_State *L;
  BCIns *pc;
  BloomFilter rfilt;
  TValue *frame;
  SnapEntry *map;
  MSize nent;
  MSize n;
  SnapShot *snap;
  GCtrace *T;
  SnapNo snapno;
  ExitState *ex;
  void *exptr_local;
  jit_State *J_local;
  uint64_t pcbase;
  
  lim = J->exitno;
  T_00 = (GCtrace *)J->trace[J->parent].gcptr64;
  pSVar7 = T_00->snap + lim;
  uVar6 = (uint)pSVar7->nent;
  pSVar4 = T_00->snapmap;
  uVar2 = pSVar7->mapofs;
  rfilt_00 = snap_renamefilter(T_00,lim);
  puVar8 = (uint *)(*(ulong *)(pSVar4 + (ulong)uVar2 + (ulong)uVar6) >> 8);
  L_00 = J->L;
  *(uint **)(((ulong)L_00->cframe & 0xfffffffffffffffc) + 0x18) = puVar8 + 1;
  if ((TValue *)(L_00->maxstack).ptr64 <= L_00->base + (int)(uint)pSVar7->topslot) {
    L_00->top = L_00->base +
                (int)(uint)*(byte *)(*(long *)((L_00->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d
                                    );
    lj_state_growstack(L_00,(uint)pSVar7->topslot -
                            (uint)*(byte *)(*(long *)((L_00->base[-2].u64 & 0x7fffffffffff) + 0x20)
                                           + -0x5d));
  }
  pTVar5 = L_00->base;
  map._4_4_ = 0;
  do {
    if (uVar6 <= map._4_4_) {
      L_00->base = L_00->base + (byte)pSVar4[(ulong)uVar2 + (ulong)uVar6];
      cVar1 = (char)*puVar8;
      if ((((cVar1 == '?') || (cVar1 == 'A')) || (cVar1 == 'C')) ||
         ((cVar1 == 'I' || (0x58 < (*puVar8 & 0xff))))) {
        L_00->top = pTVar5 + (long)(int)(uint)pSVar7->nslots + -2;
      }
      else {
        L_00->top = L_00->base +
                    (int)(uint)*(byte *)(*(long *)((L_00->base[-2].u64 & 0x7fffffffffff) + 0x20) +
                                        -0x5d);
      }
      return puVar8;
    }
    uVar3 = pSVar4[(ulong)uVar2 + (ulong)map._4_4_];
    if ((uVar3 & 0x40000) == 0) {
      o_00 = pTVar5 + ((ulong)(uVar3 >> 0x18) - 2);
      ref_00 = uVar3 & 0xffff;
      if (T_00->ir[ref_00].field_1.r == 0xfd) {
        for (local_cc = 0; local_cc < map._4_4_; local_cc = local_cc + 1) {
          if ((pSVar4[(ulong)uVar2 + (ulong)local_cc] & 0xffff) == ref_00) {
            *o_00 = pTVar5[(ulong)(pSVar4[(ulong)uVar2 + (ulong)local_cc] >> 0x18) - 2];
            goto LAB_00150528;
          }
        }
        snap_unsink(J,T_00,(ExitState *)exptr,lim,rfilt_00,T_00->ir + ref_00,o_00);
      }
      else {
        snap_restoreval(J,T_00,(ExitState *)exptr,lim,rfilt_00,ref_00,o_00);
        if ((uVar3 & 0x100000) != 0) {
          (o_00->field_4).i = (int)o_00->n;
          (o_00->field_4).it = 0xfffe7fff;
        }
      }
    }
LAB_00150528:
    map._4_4_ = map._4_4_ + 1;
  } while( true );
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      } else if ((sn & SNAP_KEYINDEX)) {
	/* A IRT_INT key index slot is restored as a number. Undo this. */
	o->u32.lo = (uint32_t)(LJ_DUALNUM ? intV(o) : lj_num2int(numV(o)));
	o->u32.hi = LJ_KEYINDEX;
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  return pc;
}